

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Reset
          (List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this
          )

{
  Type buffer;
  
  buffer = (this->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer;
  if (buffer != (Type)0x0) {
    Memory::HeapAllocator::Free
              ((this->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).alloc,
               buffer,(long)this->length * 2);
    (this->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer = (Type)0x0;
    (this->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }